

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O2

int __thiscall
QTableViewPrivate::sectionSpanEndLogical
          (QTableViewPrivate *this,QHeaderView *header,int logical,int span)

{
  int iVar1;
  int iVar2;
  int i;
  int iVar3;
  
  iVar1 = QHeaderView::visualIndex(header,logical);
  iVar3 = 1;
  while( true ) {
    if (span <= iVar3) {
      return logical;
    }
    iVar2 = QHeaderView::count(header);
    if (iVar2 <= iVar1 + iVar3) break;
    logical = QHeaderView::logicalIndex(header,iVar1 + iVar3);
    iVar3 = iVar3 + 1;
  }
  return logical;
}

Assistant:

int QTableViewPrivate::sectionSpanEndLogical(const QHeaderView *header, int logical, int span) const
{
    int visual = header->visualIndex(logical);
    for (int i = 1; i < span; ) {
        if (++visual >= header->count())
            break;
        logical = header->logicalIndex(visual);
        ++i;
    }
    return logical;
}